

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

string * __thiscall
pbrt::SpectrumTextureHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumTextureHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  char *pcVar3;
  uint uVar4;
  SpectrumPtexTexture *this_00;
  size_type __dnew;
  size_type local_20;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          ).bits;
  this_00 = (SpectrumPtexTexture *)(uVar1 & 0xffffffffffff);
  if (this_00 == (SpectrumPtexTexture *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x7274706c6c756e28;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x29;
    __return_storage_ptr__->_M_string_length = 9;
  }
  else {
    uVar4 = (uint)(uVar1 >> 0x31);
    uVar2 = (ushort)(uVar1 >> 0x30);
    if (uVar4 < 3) {
      if (uVar2 < 3) {
        if (uVar1 >> 0x31 == 0) {
          SpectrumImageTexture::ToString_abi_cxx11_
                    (__return_storage_ptr__,(SpectrumImageTexture *)this_00);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          local_20 = 0x17;
          pcVar3 = (char *)std::__cxx11::string::_M_create
                                     ((ulong *)__return_storage_ptr__,(ulong)&local_20);
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
          builtin_strncpy(pcVar3,"GPUSpectrumImageTexture",0x17);
          __return_storage_ptr__->_M_string_length = local_20;
          (__return_storage_ptr__->_M_dataplus)._M_p[local_20] = '\0';
        }
      }
      else if (uVar1 >> 0x32 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        detail::
        stringPrintfRecursive<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
                  (__return_storage_ptr__,"[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]",
                   (SpectrumTextureHandle *)this_00,
                   (SpectrumTextureHandle *)&(this_00->super_PtexTextureBase).filename,
                   (FloatTextureHandle *)&(this_00->super_PtexTextureBase).filename._M_string_length
                  );
      }
      else if (uVar2 < 5) {
        SpectrumScaledTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumScaledTexture *)this_00);
      }
      else {
        SpectrumConstantTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumConstantTexture *)this_00);
      }
    }
    else if (uVar1 >> 0x33 == 0) {
      if (uVar2 < 7) {
        SpectrumBilerpTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumBilerpTexture *)this_00);
      }
      else {
        SpectrumCheckerboardTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(SpectrumCheckerboardTexture *)this_00);
      }
    }
    else if (uVar2 < 9) {
      MarbleTexture::ToString_abi_cxx11_(__return_storage_ptr__,(MarbleTexture *)this_00);
    }
    else if (uVar4 < 5) {
      SpectrumDotsTexture::ToString_abi_cxx11_
                (__return_storage_ptr__,(SpectrumDotsTexture *)this_00);
    }
    else {
      SpectrumPtexTexture::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumTextureHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}